

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  xmlXPathObjectPtr pxVar5;
  xmlChar *str;
  byte bVar6;
  uint uVar7;
  byte *pbVar8;
  xmlChar *pxVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  void *pvVar16;
  undefined8 local_48;
  void *local_40;
  double local_38;
  
  pbVar4 = ctxt->cur;
  while( true ) {
    pbVar8 = pbVar4 + 1;
    bVar6 = *pbVar4;
    uVar3 = (ulong)bVar6;
    if (0x28 < uVar3) break;
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar3 & 0x3f) & 1) != 0) goto switchD_001c593c_caseD_27;
      break;
    }
    ctxt->cur = pbVar8;
    pbVar4 = pbVar8;
  }
  if ((byte)(bVar6 - 0x30) < 10) goto switchD_001c593c_caseD_27;
  switch(bVar6) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001c593c_caseD_28:
    pbVar4 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
    pxVar9 = ctxt->cur;
    uVar7 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar7 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0))
    goto LAB_001c5c32;
    if (uVar7 < 0x100) {
      if ((uVar7 - 0xc0 < 0x17 || (uVar7 & 0xdf) - 0x41 < 0x1a) ||
         (0xf7 < uVar7 || uVar7 - 0xd8 < 0x1f)) goto LAB_001c60f0;
LAB_001c6414:
      if (uVar7 < 0x100) {
        if (((char)uVar7 == '_') || ((uVar7 & 0xff) == 0x3a)) goto LAB_001c60f0;
      }
      else if ((uVar7 - 0x3021 < 9 || uVar7 - 0x4e00 < 0x51a6) || uVar7 == 0x3007)
      goto LAB_001c60f0;
LAB_001c5c32:
      str = (xmlChar *)0x0;
    }
    else {
      iVar12 = xmlCharInRange(uVar7,&xmlIsBaseCharGroup);
      if (iVar12 == 0) goto LAB_001c6414;
LAB_001c60f0:
      while ((0x3e < uVar7 || ((0x4000800100000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0))) {
        if (uVar7 < 0x100) {
          if ((0x16 < uVar7 - 0xc0 && 0x19 < (uVar7 & 0xdf) - 0x41) &&
             (uVar7 < 0xf8 && 0x1e < uVar7 - 0xd8)) {
LAB_001c6167:
            if (uVar7 < 0x100) {
              if (9 < uVar7 - 0x30) {
LAB_001c61ba:
                if ((0x32 < uVar7 - 0x2d) ||
                   ((0x4000000002003U >> ((ulong)(uVar7 - 0x2d) & 0x3f) & 1) == 0)) {
                  if (uVar7 < 0x100) {
                    uVar7 = (uint)(uVar7 == 0xb7);
                  }
                  else {
                    iVar12 = xmlCharInRange(uVar7,&xmlIsCombiningGroup);
                    if (iVar12 != 0) goto LAB_001c61d3;
                    uVar7 = xmlCharInRange(uVar7,&xmlIsExtenderGroup);
                  }
                  if (uVar7 == 0) break;
                }
              }
            }
            else if (((8 < uVar7 - 0x3021 && 0x51a5 < uVar7 - 0x4e00) && uVar7 != 0x3007) &&
                    (iVar12 = xmlCharInRange(uVar7,&xmlIsDigitGroup), iVar12 == 0))
            goto LAB_001c61ba;
          }
        }
        else {
          iVar12 = xmlCharInRange(uVar7,&xmlIsBaseCharGroup);
          if (iVar12 == 0) goto LAB_001c6167;
        }
LAB_001c61d3:
        ctxt->cur = ctxt->cur + (int)local_48;
        uVar7 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
      }
      str = xmlStrndup(pxVar9,*(int *)&ctxt->cur - (int)pxVar9);
      if (str == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      ctxt->cur = pxVar9;
    }
    if (str == (xmlChar *)0x0) {
      xmlXPathErr(ctxt,7);
      return;
    }
    pxVar9 = xmlStrstr(str,(xmlChar *)"::");
    if (pxVar9 == (xmlChar *)0x0) {
      iVar12 = xmlStrlen(str);
      lVar13 = (long)iVar12;
      do {
        xVar1 = ctxt->cur[lVar13];
        if (xVar1 != ' ') {
          bVar14 = false;
          if ((xVar1 == '\0') || (bVar14 = false, xVar1 == '/')) goto LAB_001c6487;
          if ((1 < (byte)(xVar1 - 9)) && (xVar1 != '\r')) goto LAB_001c6439;
        }
        lVar13 = lVar13 + 1;
      } while( true );
    }
    (*xmlFree)(str);
  case 0x2a:
  case 0x2f:
switchD_001c593c_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,*ctxt->cur == '/' ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar4 = ctxt->cur;
    while( true ) {
      uVar3 = (ulong)*pbVar4;
      if (0x2f < uVar3) break;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x2f) goto LAB_001c62e2;
        break;
      }
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
    goto LAB_001c6391;
  case 0x2e:
    if (9 < (byte)(*pbVar8 - 0x30)) {
      if ((0x16 < bVar6 - 0x2a) || ((0x400031U >> (bVar6 - 0x2a & 0x1f) & 1) == 0))
      goto switchD_001c593c_caseD_28;
      goto switchD_001c593c_caseD_2a;
    }
    break;
  default:
    if (bVar6 != 0x22) {
      if (bVar6 != 0x40) goto switchD_001c593c_caseD_28;
      goto switchD_001c593c_caseD_2a;
    }
  }
switchD_001c593c_caseD_27:
  pbVar4 = ctxt->cur;
  while( true ) {
    pbVar8 = pbVar4 + 1;
    bVar6 = *pbVar4;
    uVar3 = (ulong)bVar6;
    if (0x28 < uVar3) break;
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x24) goto LAB_001c57ee;
      if (uVar3 == 0x28) goto LAB_001c57c9;
      break;
    }
    ctxt->cur = pbVar8;
    pbVar4 = pbVar8;
  }
  bVar10 = bVar6 - 0x30;
  if (bVar10 < 10) {
LAB_001c58af:
    if (ctxt->error == 0) {
      if (bVar6 != 0x2e && (byte)(bVar6 - 0x3a) < 0xf6) {
        iVar12 = 1;
        goto LAB_001c5a7d;
      }
      if (bVar10 < 10) {
        pvVar16 = (void *)0x0;
        do {
          ctxt->cur = pbVar8;
          pvVar16 = (void *)((double)((byte)uVar3 & 0xf) + (double)pvVar16 * 10.0);
          bVar6 = *pbVar8;
          uVar3 = (ulong)bVar6;
          pbVar8 = pbVar8 + 1;
        } while ((byte)(bVar6 - 0x30) < 10);
      }
      else {
        pvVar16 = (void *)0x0;
      }
      if (bVar6 == 0x2e) {
        ctxt->cur = pbVar8;
        bVar6 = *pbVar8;
        local_40 = pvVar16;
        if (bVar6 < 0x30) {
          if (bVar10 < 10) goto LAB_001c5e2e;
LAB_001c5e14:
          xmlXPathErr(ctxt,1);
          bVar14 = false;
          pvVar16 = local_40;
        }
        else {
          if ((9 < bVar10) && (0x39 < bVar6)) goto LAB_001c5e14;
LAB_001c5e2e:
          uVar3 = 0;
          if (bVar6 == 0x30) {
            uVar3 = 0;
            do {
              ctxt->cur = pbVar8 + uVar3 + 1;
              lVar13 = uVar3 + 1;
              uVar3 = uVar3 + 1;
            } while (pbVar8[lVar13] == 0x30);
          }
          uVar7 = (uint)uVar3;
          pbVar4 = ctxt->cur;
          bVar6 = *pbVar4;
          local_38 = 0.0;
          if ((byte)(bVar6 - 0x30) < 10) {
            uVar11 = uVar7 + 0x14;
            do {
              pbVar4 = pbVar4 + 1;
              local_38 = local_38 * 10.0 + (double)(int)(bVar6 - 0x30);
              uVar7 = (int)uVar3 + 1;
              uVar3 = (ulong)uVar7;
              ctxt->cur = pbVar4;
              bVar6 = *pbVar4;
              if (9 < (byte)(bVar6 - 0x30)) break;
            } while (uVar7 < uVar11);
          }
          dVar15 = pow(10.0,(double)(int)uVar7);
          pxVar9 = ctxt->cur;
          bVar14 = true;
          xVar1 = *pxVar9;
          while (pvVar16 = (void *)((double)local_40 + local_38 / dVar15), (byte)(xVar1 - 0x30) < 10
                ) {
            pxVar9 = pxVar9 + 1;
            ctxt->cur = pxVar9;
            xVar1 = *pxVar9;
          }
        }
        if (!bVar14) goto LAB_001c5a82;
      }
      pbVar4 = ctxt->cur;
      if ((*pbVar4 | 0x20) == 0x65) {
        ctxt->cur = pbVar4 + 1;
        bVar6 = pbVar4[1];
        if ((bVar6 == 0x2d) || (bVar6 == 0x2b)) {
          ctxt->cur = pbVar4 + 2;
        }
        pbVar4 = ctxt->cur;
        bVar10 = *pbVar4;
        iVar12 = 0;
        if ((byte)(bVar10 - 0x30) < 10) {
          iVar12 = 0;
          do {
            pbVar4 = pbVar4 + 1;
            iVar2 = (bVar10 - 0x30) + iVar12 * 10;
            if (999999 < iVar12) {
              iVar2 = iVar12;
            }
            iVar12 = iVar2;
            ctxt->cur = pbVar4;
            bVar10 = *pbVar4;
          } while ((byte)(bVar10 - 0x30) < 10);
        }
        iVar2 = -iVar12;
        if (bVar6 != 0x2d) {
          iVar2 = iVar12;
        }
        local_40 = pvVar16;
        dVar15 = pow(10.0,(double)iVar2);
        pvVar16 = (void *)((double)local_40 * dVar15);
      }
      pxVar5 = xmlXPathCacheNewFloat(ctxt,(double)pvVar16);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar5,
                                     (void *)0x0);
        if (iVar12 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar5);
        }
      }
    }
  }
  else if ((bVar6 == 0x22) || (bVar6 == 0x27)) {
    pxVar9 = xmlXPathParseLiteral(ctxt);
    if (pxVar9 != (xmlChar *)0x0) {
      pxVar5 = xmlXPathCacheNewString(ctxt,pxVar9);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar5,
                                     (void *)0x0);
        if (iVar12 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar5);
        }
      }
      (*xmlFree)(pxVar9);
    }
  }
  else {
    if ((bVar6 == 0x2e) && ((byte)(*pbVar8 - 0x30) < 10)) goto LAB_001c58af;
    pxVar9 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
    if (pxVar9 == (xmlChar *)0x0) {
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
    else {
      pbVar4 = ctxt->cur;
      while( true ) {
        pbVar8 = pbVar4 + 1;
        uVar3 = (ulong)*pbVar4;
        if (0x28 < uVar3) break;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 == 0x28) goto LAB_001c5c5c;
          break;
        }
        ctxt->cur = pbVar8;
        pbVar4 = pbVar8;
      }
      (*xmlFree)(pxVar9);
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
    iVar12 = 7;
LAB_001c5a7d:
    xmlXPathErr(ctxt,iVar12);
  }
LAB_001c5a82:
  pbVar4 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar4 + 1;
    pbVar4 = pbVar4 + 1;
  }
LAB_001c5aaa:
  if (ctxt->error == 0) {
    pbVar4 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
    while (*ctxt->cur == '[') {
      xmlXPathCompPredicate(ctxt,1);
      pbVar4 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
      }
    }
  }
  if (ctxt->error == 0) {
    pxVar9 = ctxt->cur;
    if (*pxVar9 == '/') {
      if (pxVar9[1] == '/') {
        pbVar4 = pxVar9 + 2;
        while( true ) {
          ctxt->cur = pbVar4;
          if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
          break;
          pbVar4 = pbVar4 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
LAB_001c6391:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
LAB_001c6399:
    pbVar4 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
  }
  return;
LAB_001c6439:
  if (xVar1 == '(') {
    iVar12 = xmlXPathIsNodeType(str);
    bVar14 = iVar12 == 0;
  }
  else {
    bVar14 = false;
  }
LAB_001c6487:
  xVar1 = ctxt->cur[lVar13];
  (*xmlFree)(str);
  if ((xVar1 == '\0') || (!bVar14)) goto switchD_001c593c_caseD_2a;
  goto switchD_001c593c_caseD_27;
LAB_001c62e2:
  do {
    pbVar4 = ctxt->cur;
    if (*pbVar4 != 0x2f) break;
    if (pbVar4[1] == 0x2f) {
      pbVar4 = pbVar4 + 2;
      while( true ) {
        ctxt->cur = pbVar4;
        if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
        pbVar4 = pbVar4 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001c637d:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar4 = pbVar4 + 1;
        ctxt->cur = pbVar4;
        bVar6 = *pbVar4;
        uVar3 = (ulong)bVar6;
        if (0x20 < uVar3) goto LAB_001c6329;
      } while ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0);
      if (uVar3 != 0) {
LAB_001c6329:
        if ((((char)bVar6 < '\0') || ((byte)((bVar6 | 0x20) + 0x9f) < 0x1a)) ||
           ((bVar6 - 0x2a < 0x36 && ((0x20000000400011U >> ((ulong)(bVar6 - 0x2a) & 0x3f) & 1) != 0)
            ))) goto LAB_001c637d;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001c6399;
LAB_001c57ee:
  uVar3 = (ulong)pbVar8[-1];
  if (uVar3 < 0x25) {
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_001c57e8;
    if (uVar3 == 0x24) {
      ctxt->cur = pbVar8;
      pxVar9 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
      if (pxVar9 != (xmlChar *)0x0) {
        ctxt->comp->last = -1;
        iVar12 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar9,
                                     (void *)CONCAT44(local_48._4_4_,(int)local_48));
        if (iVar12 == -1) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          (*xmlFree)(pxVar9);
        }
        pbVar4 = ctxt->cur;
        while( true ) {
          if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
          break;
          ctxt->cur = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
        }
        if ((ctxt->context != (xmlXPathContextPtr)0x0) &&
           (iVar12 = 0x18, (ctxt->context->flags & 2) != 0)) goto LAB_001c5a7d;
        goto LAB_001c5a82;
      }
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
  }
  goto LAB_001c5a75;
LAB_001c57e8:
  ctxt->cur = pbVar8;
  pbVar8 = pbVar8 + 1;
  goto LAB_001c57ee;
LAB_001c5a75:
  iVar12 = 4;
  goto LAB_001c5a7d;
LAB_001c57c9:
  while( true ) {
    ctxt->cur = pbVar8;
    if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
    pbVar8 = pbVar8 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar4 = ctxt->cur;
    if (*pbVar4 == 0x29) {
      do {
        pbVar4 = pbVar4 + 1;
        ctxt->cur = pbVar4;
        if (0x20 < (ulong)*pbVar4) break;
      } while ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0);
      goto LAB_001c5a82;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001c5aaa;
LAB_001c5c5c:
  while( true ) {
    ctxt->cur = pbVar8;
    if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
    pbVar8 = pbVar8 + 1;
  }
  local_40 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  uVar7 = 1;
  if ((local_40 == (void *)0x0) && (*pxVar9 == 'c')) {
    iVar12 = xmlStrEqual(pxVar9,(xmlChar *)"count");
    uVar7 = (uint)(iVar12 == 0);
  }
  ctxt->comp->last = -1;
  iVar12 = 0;
  if (*ctxt->cur == ')') {
LAB_001c605b:
    pvVar16 = local_40;
    iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_FUNCTION,iVar12,0,0,pxVar9,
                                 local_40);
    if (iVar12 == -1) {
      (*xmlFree)(pvVar16);
      (*xmlFree)(pxVar9);
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    pbVar4 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
  }
  else {
    iVar12 = 0;
    do {
      if (*ctxt->cur == '\0') goto LAB_001c605b;
      iVar2 = ctxt->comp->last;
      ctxt->comp->last = -1;
      xmlXPathCompileExpr(ctxt,uVar7);
      if (ctxt->error == 0) {
        xmlXPathCompExprAdd(ctxt,iVar2,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0);
        iVar12 = iVar12 + 1;
        pbVar4 = ctxt->cur;
        if (*pbVar4 == 0x29) {
          iVar2 = 7;
        }
        else {
          if (*pbVar4 != 0x2c) {
            (*xmlFree)(pxVar9);
            (*xmlFree)(local_40);
            xmlXPathErr(ctxt,7);
            goto LAB_001c5d4f;
          }
          do {
            pbVar4 = pbVar4 + 1;
            ctxt->cur = pbVar4;
            if (0x20 < (ulong)*pbVar4) break;
          } while ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0);
          iVar2 = 0;
        }
      }
      else {
        (*xmlFree)(pxVar9);
        (*xmlFree)(local_40);
LAB_001c5d4f:
        iVar2 = 1;
      }
    } while (iVar2 == 0);
    if (iVar2 == 7) goto LAB_001c605b;
  }
  goto LAB_001c5a82;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
			lc = 1;
		    } else {
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}